

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O2

int SUNLinSolSetup_SPGMR(SUNLinearSolver S,SUNMatrix A)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  pvVar2 = S->content;
  iVar3 = 0;
  if (*(code **)((long)pvVar2 + 0x38) != (code *)0x0) {
    iVar1 = (**(code **)((long)pvVar2 + 0x38))(*(undefined8 *)((long)pvVar2 + 0x48));
    pvVar2 = S->content;
    iVar3 = 0;
    if ((iVar1 != 0) && (iVar3 = 0x324, iVar1 < 0)) {
      iVar3 = -0x326;
    }
  }
  *(int *)((long)pvVar2 + 0x20) = iVar3;
  return iVar3;
}

Assistant:

int SUNLinSolSetup_SPGMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A)
{
  SUNFunctionBegin(S->sunctx);

  int status = SUN_SUCCESS;

  /* Set shortcuts to SPGMR memory structures */
  SUNPSetupFn Psetup = SPGMR_CONTENT(S)->Psetup;
  void* PData        = SPGMR_CONTENT(S)->PData;

  /* no solver-specific setup is required, but if user-supplied
     Psetup routine exists, call that here */
  if (Psetup != NULL)
  {
    status = Psetup(PData);
    if (status != 0)
    {
      LASTFLAG(S) = (status < 0) ? SUNLS_PSET_FAIL_UNREC : SUNLS_PSET_FAIL_REC;
      return (LASTFLAG(S));
    }
  }

  /* return with success */
  LASTFLAG(S) = SUN_SUCCESS;
  return SUN_SUCCESS;
}